

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O3

int secp256k1_der_read_len(size_t *len,uchar **sigp,uchar *sigend)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar8;
  ulong uVar7;
  
  *len = 0;
  pbVar5 = *sigp;
  uVar3 = 0;
  if (pbVar5 < sigend) {
    pbVar1 = pbVar5 + 1;
    *sigp = pbVar1;
    bVar2 = *pbVar5;
    if ((ulong)bVar2 != 0xff) {
      if (-1 < (char)bVar2) {
        *len = (ulong)bVar2;
        return 1;
      }
      if (bVar2 != 0x80) {
        uVar6 = bVar2 & 0x7f;
        uVar7 = (ulong)uVar6;
        if (((uVar7 <= (ulong)((long)sigend - (long)pbVar1)) && ((byte)uVar6 < 9)) && (*pbVar1 != 0)
           ) {
          if (uVar7 == 0) {
            uVar8 = 0;
          }
          else {
            pbVar5 = pbVar5 + 2;
            uVar4 = 0;
            uVar8 = 0;
            do {
              uVar8 = (ulong)pbVar5[-1] | uVar8 << 8;
              *len = uVar8;
              *sigp = pbVar5;
              pbVar5 = pbVar5 + 1;
              uVar4 = uVar4 + 1;
            } while (uVar7 != uVar4);
            if (((long)sigend - (long)pbVar1) - uVar4 < uVar8) {
              return 0;
            }
          }
          uVar3 = (uint)(0x7f < uVar8);
        }
      }
    }
  }
  return uVar3;
}

Assistant:

static int secp256k1_der_read_len(size_t *len, const unsigned char **sigp, const unsigned char *sigend) {
    size_t lenleft;
    unsigned char b1;
    VERIFY_CHECK(len != NULL);
    *len = 0;
    if (*sigp >= sigend) {
        return 0;
    }
    b1 = *((*sigp)++);
    if (b1 == 0xFF) {
        /* X.690-0207 8.1.3.5.c the value 0xFF shall not be used. */
        return 0;
    }
    if ((b1 & 0x80) == 0) {
        /* X.690-0207 8.1.3.4 short form length octets */
        *len = b1;
        return 1;
    }
    if (b1 == 0x80) {
        /* Indefinite length is not allowed in DER. */
        return 0;
    }
    /* X.690-207 8.1.3.5 long form length octets */
    lenleft = b1 & 0x7F; /* lenleft is at least 1 */
    if (lenleft > (size_t)(sigend - *sigp)) {
        return 0;
    }
    if (**sigp == 0) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    if (lenleft > sizeof(size_t)) {
        /* The resulting length would exceed the range of a size_t, so
         * certainly longer than the passed array size.
         */
        return 0;
    }
    while (lenleft > 0) {
        *len = (*len << 8) | **sigp;
        (*sigp)++;
        lenleft--;
    }
    if (*len > (size_t)(sigend - *sigp)) {
        /* Result exceeds the length of the passed array. */
        return 0;
    }
    if (*len < 128) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    return 1;
}